

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O3

vec3 djb::normalize(vec3 *v)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  float fVar4;
  vec3 vVar5;
  
  uVar2 = v->x;
  uVar3 = v->y;
  fVar1 = v->z;
  fVar4 = fVar1 * fVar1 + (float)uVar2 * (float)uVar2 + (float)uVar3 * (float)uVar3;
  if (0.0 < fVar4) {
    fVar4 = 1.0 / SQRT(fVar4);
    vVar5.x = fVar4 * (float)uVar2;
    vVar5.y = fVar4 * (float)uVar3;
    vVar5.z = fVar4 * fVar1;
    return vVar5;
  }
  __assert_fail("x > T(0)",
                "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/demo-merl/dj_brdf.h"
                ,0x259,"T djb::inversesqrt(const T &) [T = float]");
}

Assistant:

static float_t dot(const vec3 &a, const vec3 &b)
{
	return (a.x * b.x + a.y * b.y + a.z * b.z);
}